

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_shader_module
          (Impl *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob,
          ScratchAllocator *blob_allocator)

{
  size_t size_00;
  size_t sVar1;
  uchar *puVar2;
  Ch *__src;
  reference pvVar3;
  undefined1 local_1a8 [8];
  CustomWriter writer;
  StringBuffer buffer;
  GenericStringRef<char> local_128;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_118;
  GenericStringRef<char> local_108;
  GenericStringRef<char> local_f8;
  GenericStringRef<char> local_e8;
  GenericStringRef<char> local_d8;
  undefined1 local_c8 [8];
  Value varint;
  uint8_t *encoded;
  size_t size;
  Value serialized_shader_modules;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc;
  Document doc;
  ScratchAllocator *blob_allocator_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *blob_local;
  VkShaderModuleCreateInfo *create_info_local;
  Hash hash_local;
  Impl *this_local;
  
  doc.parseResult_.offset_ = (size_t)blob_allocator;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&alloc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&alloc);
  serialized_shader_modules.data_.o.members =
       (Member *)
       rapidjson::
       GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       *)&alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&size,kObjectType);
  size_00 = compute_size_varint(create_info->pCode,create_info->codeSize >> 2);
  varint.data_.s.str =
       (Ch *)ScratchAllocator::allocate_raw
                       ((ScratchAllocator *)doc.parseResult_.offset_,size_00,0x40);
  encode_varint((uint8_t *)varint.data_.s.str,create_info->pCode,create_info->codeSize >> 2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_c8,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_d8,(char (*) [13])"varintOffset");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c8,&local_d8,0,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 serialized_shader_modules.data_.o.members);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_e8,(char (*) [11])"varintSize");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_c8,&local_e8,size_00,
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             serialized_shader_modules.data_.o.members);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_f8,(char (*) [9])"codeSize");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_c8,&local_f8,create_info->codeSize,
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             serialized_shader_modules.data_.o.members);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_108,(char (*) [6])0x5dad15);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_c8,&local_108,0,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 serialized_shader_modules.data_.o.members);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_118,hash,
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             serialized_shader_modules.data_.o.members);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&size,&local_118,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_c8,
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
            serialized_shader_modules.data_.o.members);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_118);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_128,(char (*) [8])0x62a218);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  AddMember<Fossilize::__2>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&alloc,&local_128,FOSSILIZE_FORMAT_VERSION,
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             serialized_shader_modules.data_.o.members);
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>
            ((GenericStringRef<char> *)&buffer.stack_.initialCapacity_,
             (char (*) [14])"shaderModules");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&alloc,(StringRefType *)&buffer.stack_.initialCapacity_,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&size,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                     serialized_shader_modules.data_.o.members);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  GenericStringBuffer((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x100);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *)local_1a8,
           (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
           &writer.maxDecimalPlaces_,(CrtAllocator *)0x0,0x20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&alloc,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_1a8);
  sVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(blob,sVar1 + 1 + size_00);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(blob);
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
  sVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
  memcpy(puVar2,__src,sVar1);
  sVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](blob,sVar1);
  *pvVar3 = '\0';
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(blob);
  sVar1 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetSize
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &writer.maxDecimalPlaces_);
  memcpy(puVar2 + sVar1 + 1,varint.data_.s.str,size_00);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::~Writer((Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *)local_1a8);
  rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ~GenericStringBuffer
            ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             &writer.maxDecimalPlaces_);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_c8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&size);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&alloc);
  return true;
}

Assistant:

bool StateRecorder::Impl::serialize_shader_module(Hash hash, const VkShaderModuleCreateInfo &create_info,
                                                  vector<uint8_t> &blob, ScratchAllocator &blob_allocator) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value serialized_shader_modules(kObjectType);

	size_t size = compute_size_varint(create_info.pCode, create_info.codeSize / 4);
	uint8_t *encoded = static_cast<uint8_t *>(blob_allocator.allocate_raw(size, 64));
	encode_varint(encoded, create_info.pCode, create_info.codeSize / 4);

	Value varint(kObjectType);
	varint.AddMember("varintOffset", 0, alloc);
	varint.AddMember("varintSize", uint64_t(size), alloc);
	varint.AddMember("codeSize", uint64_t(create_info.codeSize), alloc);
	varint.AddMember("flags", 0, alloc);

	// Varint binary form, starts at offset 0 after the delim '\0' character.
	serialized_shader_modules.AddMember(uint64_string(hash, alloc), varint, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("shaderModules", serialized_shader_modules, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize() + 1 + size);
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	blob[buffer.GetSize()] = '\0';
	memcpy(blob.data() + buffer.GetSize() + 1, encoded, size);
	return true;
}